

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

local_iterator * __thiscall
google::
sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::begin(local_iterator *__return_storage_ptr__,
       sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *this,size_type i)

{
  pointer psVar1;
  pointer psVar2;
  uint uVar3;
  nonempty_iterator local_38;
  
  psVar1 = (this->table).groups.
           super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (int)i + (int)(i / 0x30) * -0x30;
  if ((psVar1[i / 0x30].bitmap[uVar3 >> 3] >> (uVar3 & 7) & 1) == 0) {
    psVar2 = (this->table).groups.
             super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __return_storage_ptr__->ht = this;
    (__return_storage_ptr__->pos).row_begin._M_current = psVar1;
    (__return_storage_ptr__->pos).row_end._M_current = psVar2;
    (__return_storage_ptr__->pos).row_current._M_current = psVar2;
    (__return_storage_ptr__->pos).col_current = (nonempty_iterator)0x0;
    (__return_storage_ptr__->end).row_begin._M_current = psVar1;
    (__return_storage_ptr__->end).row_end._M_current = psVar2;
    (__return_storage_ptr__->end).row_current._M_current = psVar2;
    (__return_storage_ptr__->end).col_current = (nonempty_iterator)0x0;
  }
  else {
    sparsetable<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::get_iter(&local_38,&this->table,i);
    psVar1 = (this->table).groups.
             super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->table).groups.
             super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->pos).row_current._M_current = local_38.row_current._M_current;
    (__return_storage_ptr__->pos).col_current = local_38.col_current;
    (__return_storage_ptr__->pos).row_begin._M_current = local_38.row_begin._M_current;
    (__return_storage_ptr__->pos).row_end._M_current = local_38.row_end._M_current;
    __return_storage_ptr__->ht = this;
    (__return_storage_ptr__->end).row_begin._M_current = psVar1;
    (__return_storage_ptr__->end).row_end._M_current = psVar2;
    (__return_storage_ptr__->end).row_current._M_current = psVar2;
    (__return_storage_ptr__->end).col_current = (nonempty_iterator)0x0;
  }
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

local_iterator begin(size_type i) {
    if (table.test(i))
      return local_iterator(this, table.get_iter(i), table.nonempty_end());
    else
      return local_iterator(this, table.nonempty_end(), table.nonempty_end());
  }